

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O2

ssl_open_record_t bssl::skip_early_data(SSL *ssl,uint8_t *out_alert,size_t consumed)

{
  SSL3_STATE *pSVar1;
  ushort uVar2;
  
  pSVar1 = ssl->s3;
  uVar2 = pSVar1->early_data_skipped + (short)consumed;
  pSVar1->early_data_skipped = uVar2;
  if (uVar2 < consumed) {
    pSVar1->early_data_skipped = 0x4001;
  }
  else if (uVar2 < 0x4001) {
    return ssl_open_record_discard;
  }
  ERR_put_error(0x10,0,0x10e,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                ,0x46);
  *out_alert = '\n';
  return ssl_open_record_error;
}

Assistant:

static ssl_open_record_t skip_early_data(SSL *ssl, uint8_t *out_alert,
                                         size_t consumed) {
  ssl->s3->early_data_skipped += consumed;
  if (ssl->s3->early_data_skipped < consumed) {
    ssl->s3->early_data_skipped = kMaxEarlyDataSkipped + 1;
  }

  if (ssl->s3->early_data_skipped > kMaxEarlyDataSkipped) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MUCH_SKIPPED_EARLY_DATA);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  return ssl_open_record_discard;
}